

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  bool bVar1;
  ostream *poVar2;
  pointer pIVar3;
  Inst *pIVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  SparseSet reachable;
  SparseSet local_1d8;
  SparseArray<int> *local_1c0;
  pointer local_1b8;
  LogMessage local_1b0;
  
  if (fanout->max_size_ != this->size_) {
    __assert_fail("(fanout->max_size()) == (size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                  0x2e1,"void re2::Prog::Fanout(SparseArray<int> *)");
  }
  SparseSet::SparseSet(&local_1d8,this->size_);
  fanout->size_ = 0;
  SparseArray<int>::set_new(fanout,this->start_,0);
  if (fanout->size_ != 0) {
    pIVar3 = (fanout->dense_).
             super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1c0 = fanout;
    do {
      local_1d8.size_ = 0;
      iVar5 = pIVar3->index_;
      local_1b8 = pIVar3;
      bVar1 = SparseSet::contains(&local_1d8,iVar5);
      if (!bVar1) {
        SparseSet::insert_new(&local_1d8,iVar5);
      }
      if (local_1d8.size_ != 0) {
        iVar5 = *local_1d8.dense_;
        lVar8 = (long)iVar5;
        pIVar4 = this->inst_;
        uVar7 = pIVar4[lVar8].out_opcode_;
        piVar6 = local_1d8.dense_;
        switch(uVar7 & 7) {
        case 0:
          goto switchD_0012b437_caseD_0;
        case 1:
          goto switchD_0012b437_caseD_1;
        case 2:
          goto switchD_0012b437_caseD_2;
        default:
          goto switchD_0012b437_caseD_3;
        case 5:
          goto switchD_0012b437_caseD_5;
        case 7:
          goto switchD_0012b437_caseD_7;
        }
      }
LAB_0012b5c4:
      pIVar3 = local_1b8 + 1;
    } while (pIVar3 != (fanout->dense_).
                       super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                       ._M_impl.super__Vector_impl_data._M_start + fanout->size_);
  }
  SparseSet::~SparseSet(&local_1d8);
  return;
switchD_0012b437_caseD_0:
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x2ee,3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar4[lVar8].out_opcode_ & 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," in Prog::Fanout()",0x12);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
switchD_0012b437_caseD_7:
  piVar6 = piVar6 + 1;
  if (piVar6 == local_1d8.dense_ + local_1d8.size_) goto LAB_0012b5c4;
  iVar5 = *piVar6;
  lVar8 = (long)iVar5;
  pIVar4 = this->inst_;
  uVar7 = pIVar4[lVar8].out_opcode_;
  switch(uVar7 & 7) {
  case 0:
    goto switchD_0012b437_caseD_0;
  case 1:
switchD_0012b437_caseD_1:
    if ((uVar7 & 8) != 0) {
      __assert_fail("!ip->last()",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                    0x2fc,"void re2::Prog::Fanout(SparseArray<int> *)");
    }
    break;
  case 2:
switchD_0012b437_caseD_2:
    if ((uVar7 & 8) == 0) {
      iVar5 = (int)lVar8 + 1;
      bVar1 = SparseSet::contains(&local_1d8,iVar5);
      if (!bVar1) {
        SparseSet::insert_new(&local_1d8,iVar5);
      }
    }
    fanout = local_1c0;
    local_1b8->second = local_1b8->second + 1;
    uVar7 = pIVar4[lVar8].out_opcode_ >> 4;
    if (local_1c0->max_size_ <= (int)uVar7) {
      __assert_fail("(i) < (max_size_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x135,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
    }
    if ((((uint)local_1c0->max_size_ <= uVar7) ||
        ((uint)local_1c0->size_ <= (uint)local_1c0->sparse_to_dense_[uVar7])) ||
       ((local_1c0->dense_).
        super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
        ._M_impl.super__Vector_impl_data._M_start[local_1c0->sparse_to_dense_[uVar7]].index_ !=
        uVar7)) {
      SparseArray<int>::set_new(local_1c0,uVar7,0);
    }
    goto switchD_0012b437_caseD_7;
  default:
switchD_0012b437_caseD_3:
    if ((uVar7 & 8) == 0) {
      iVar5 = (int)lVar8 + 1;
      bVar1 = SparseSet::contains(&local_1d8,iVar5);
      if (!bVar1) {
        SparseSet::insert_new(&local_1d8,iVar5);
      }
    }
    uVar7 = pIVar4[lVar8].out_opcode_ >> 4;
    bVar1 = SparseSet::contains(&local_1d8,uVar7);
    fanout = local_1c0;
    if (!bVar1) {
      SparseSet::insert_new(&local_1d8,uVar7);
      fanout = local_1c0;
    }
    goto switchD_0012b437_caseD_7;
  case 5:
switchD_0012b437_caseD_5:
    if ((uVar7 & 8) != 0) goto switchD_0012b437_caseD_7;
    break;
  case 7:
    goto switchD_0012b437_caseD_7;
  }
  bVar1 = SparseSet::contains(&local_1d8,iVar5 + 1);
  if (!bVar1) {
    SparseSet::insert_new(&local_1d8,iVar5 + 1);
  }
  goto switchD_0012b437_caseD_7;
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->second;
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}